

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

void __thiscall QAccessibleComboBox::doAction(QAccessibleComboBox *this,QString *actionName)

{
  bool bVar1;
  QComboBox *pQVar2;
  QComboBox *in_RSI;
  QComboBox *cBox;
  QString *in_stack_ffffffffffffffd8;
  QComboBox *this_00;
  
  pQVar2 = comboBox((QAccessibleComboBox *)0x7d563c);
  if (pQVar2 != (QComboBox *)0x0) {
    this_00 = in_RSI;
    QAccessibleActionInterface::showMenuAction();
    bVar1 = ::operator==((QString *)this_00,in_stack_ffffffffffffffd8);
    if (!bVar1) {
      QAccessibleActionInterface::pressAction();
      bVar1 = ::operator==((QString *)this_00,(QString *)in_RSI);
      if (!bVar1) {
        return;
      }
    }
    QComboBox::view(this_00);
    bVar1 = QWidget::isVisible((QWidget *)0x7d569b);
    if (bVar1) {
      (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1b0))();
    }
    else {
      (**(code **)(*(long *)&pQVar2->super_QWidget + 0x1a8))();
    }
  }
  return;
}

Assistant:

void QAccessibleComboBox::doAction(const QString &actionName)
{
    if (QComboBox *cBox = comboBox()) {
        if (actionName == showMenuAction() || actionName == pressAction()) {
            if (cBox->view()->isVisible()) {
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    cBox->setCurrentIndex(list->selectedRows().at(0));
                }
                cBox->setFocus();
#endif
                cBox->hidePopup();
            } else {
                cBox->showPopup();
#if defined(Q_OS_ANDROID)
                const auto list = child(0)->tableInterface();
                if (list && list->selectedRowCount() > 0) {
                    auto selectedCells = list->selectedCells();
                    QAccessibleEvent ev(selectedCells.at(0),QAccessible::Focus);
                    QAccessible::updateAccessibility(&ev);
                }
#endif
            }
        }
    }
}